

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorClassifier::SupportVectorClassifier
          (SupportVectorClassifier *this,SupportVectorClassifier *from)

{
  bool bVar1;
  SupportVectorsCase SVar2;
  ClassLabelsCase CVar3;
  InternalMetadataWithArenaLite *this_00;
  Kernel *this_01;
  SparseSupportVectors *this_02;
  SparseSupportVectors *from_00;
  DenseSupportVectors *this_03;
  DenseSupportVectors *from_01;
  StringVector *this_04;
  StringVector *from_02;
  Int64Vector *this_05;
  Int64Vector *from_03;
  SupportVectorClassifier *from_local;
  SupportVectorClassifier *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SupportVectorClassifier_00d5d778
  ;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedField<int>::RepeatedField
            (&this->numberofsupportvectorsperclass_,&from->numberofsupportvectorsperclass_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::RepeatedPtrField
            (&this->coefficients_,&from->coefficients_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->rho_,&from->rho_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->proba_,&from->proba_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->probb_,&from->probb_);
  SupportVectorsUnion::SupportVectorsUnion((SupportVectorsUnion *)&this->supportVectors_);
  ClassLabelsUnion::ClassLabelsUnion((ClassLabelsUnion *)&this->ClassLabels_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  bVar1 = has_kernel(from);
  if (bVar1) {
    this_01 = (Kernel *)operator_new(0x20);
    Kernel::Kernel(this_01,from->kernel_);
    this->kernel_ = this_01;
  }
  else {
    this->kernel_ = (Kernel *)0x0;
  }
  clear_has_supportVectors(this);
  SVar2 = supportVectors_case(from);
  if (SVar2 != SUPPORTVECTORS_NOT_SET) {
    if (SVar2 == kSparseSupportVectors) {
      this_02 = mutable_sparsesupportvectors(this);
      from_00 = sparsesupportvectors(from);
      SparseSupportVectors::MergeFrom(this_02,from_00);
    }
    else if (SVar2 == kDenseSupportVectors) {
      this_03 = mutable_densesupportvectors(this);
      from_01 = densesupportvectors(from);
      DenseSupportVectors::MergeFrom(this_03,from_01);
    }
  }
  clear_has_ClassLabels(this);
  CVar3 = ClassLabels_case(from);
  if (CVar3 != CLASSLABELS_NOT_SET) {
    if (CVar3 == kStringClassLabels) {
      this_04 = mutable_stringclasslabels(this);
      from_02 = stringclasslabels(from);
      StringVector::MergeFrom(this_04,from_02);
    }
    else if (CVar3 == kInt64ClassLabels) {
      this_05 = mutable_int64classlabels(this);
      from_03 = int64classlabels(from);
      Int64Vector::MergeFrom(this_05,from_03);
    }
  }
  return;
}

Assistant:

SupportVectorClassifier::SupportVectorClassifier(const SupportVectorClassifier& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      numberofsupportvectorsperclass_(from.numberofsupportvectorsperclass_),
      coefficients_(from.coefficients_),
      rho_(from.rho_),
      proba_(from.proba_),
      probb_(from.probb_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_kernel()) {
    kernel_ = new ::CoreML::Specification::Kernel(*from.kernel_);
  } else {
    kernel_ = NULL;
  }
  clear_has_supportVectors();
  switch (from.supportVectors_case()) {
    case kSparseSupportVectors: {
      mutable_sparsesupportvectors()->::CoreML::Specification::SparseSupportVectors::MergeFrom(from.sparsesupportvectors());
      break;
    }
    case kDenseSupportVectors: {
      mutable_densesupportvectors()->::CoreML::Specification::DenseSupportVectors::MergeFrom(from.densesupportvectors());
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SupportVectorClassifier)
}